

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall
libcellml::Importer::ImporterImpl::checkForImportCycles
          (ImporterImpl *this,ImportSourcePtr *importSource,History *history,HistoryEpochPtr *h,
          string *action)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 local_90 [8];
  IssuePtr issue;
  string description;
  undefined1 local_50 [8];
  History cyclicHistory;
  string *action_local;
  HistoryEpochPtr *h_local;
  History *history_local;
  ImportSourcePtr *importSource_local;
  ImporterImpl *this_local;
  
  cyclicHistory.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)action;
  bVar1 = libcellml::checkForImportCycles(history,h);
  if (bVar1) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::vector((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
              *)local_50,history);
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                 *)local_50,h);
    formDescriptionOfCyclicDependency
              ((string *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (History *)local_50,
               (string *)
               cyclicHistory.
               super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Issue::IssueImpl::create();
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    Issue::IssueImpl::setDescription
              (peVar2->mPimpl,
               (string *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar2->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar3->mPimpl,importSource);
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    Issue::IssueImpl::setReferenceRule(peVar2->mPimpl,IMPORT_EQUIVALENT_INFOSET);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_90);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_90);
    std::__cxx11::string::~string
              ((string *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               *)local_50);
  }
  return bVar1;
}

Assistant:

bool Importer::ImporterImpl::checkForImportCycles(const ImportSourcePtr &importSource, const History &history, const HistoryEpochPtr &h, const std::string &action)
{
    if (libcellml::checkForImportCycles(history, h)) {
        auto cyclicHistory = history;
        cyclicHistory.push_back(h);
        auto description = formDescriptionOfCyclicDependency(cyclicHistory, action);
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(description);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_EQUIVALENT_INFOSET);
        addIssue(issue);
        return true;
    }

    return false;
}